

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  uint uVar2;
  unsigned_short *puVar3;
  
  if (0 < idx) {
    if ((obj->TextW).Size < idx) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    puVar3 = (obj->TextW).Data;
    bVar1 = is_separator((uint)puVar3[(ulong)(uint)idx - 1]);
    uVar2 = 0;
    if (bVar1) {
      if ((obj->TextW).Size <= idx) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        puVar3 = (obj->TextW).Data;
      }
      bVar1 = is_separator((uint)puVar3[(uint)idx]);
      uVar2 = (uint)!bVar1;
    }
    return uVar2;
  }
  return 1;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator(obj->TextW[idx - 1]) && !is_separator(obj->TextW[idx]) ) : 1; }